

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O0

big_integer *
anon_unknown.dwarf_a832::merge_all<big_integer>
          (big_integer *__return_storage_ptr__,vector<big_integer,_std::allocator<big_integer>_> *v)

{
  bool bVar1;
  size_type sVar2;
  reference other;
  vector<big_integer,_std::allocator<big_integer>_> *v_local;
  
  bVar1 = std::vector<big_integer,_std::allocator<big_integer>_>::empty(v);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    while (sVar2 = std::vector<big_integer,_std::allocator<big_integer>_>::size(v), 1 < sVar2) {
      merge_two<big_integer>(v);
    }
    other = std::vector<big_integer,_std::allocator<big_integer>_>::operator[](v,0);
    big_integer::big_integer(__return_storage_ptr__,other);
    return __return_storage_ptr__;
  }
  __assert_fail("!v.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/maxLundin[P]BigInteger/big_integer_testing.cpp"
                ,0x266,"T (anonymous namespace)::merge_all(std::vector<T>) [T = big_integer]");
}

Assistant:

T merge_all(std::vector<T> v) {
        assert(!v.empty());

        while (v.size() >= 2)
            merge_two(v);

        return v[0];
    }